

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::InstanceIntersectorKMB<8>_>,_false>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  ulong uVar2;
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 aVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  AABBNodeMB4D *node1;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  undefined1 (*pauVar16) [32];
  ulong *puVar17;
  uint uVar18;
  Primitive *prim;
  bool bVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  Precalculations pre;
  vbool<8> valid0;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_59c1;
  ulong local_59c0;
  RayK<8> *local_59b8;
  RayQueryContext *local_59b0;
  ulong local_59a8;
  undefined1 local_59a0 [32];
  undefined1 local_5980 [32];
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 local_5960;
  undefined1 local_5940 [32];
  undefined1 local_5920 [32];
  float local_5900;
  float fStack_58fc;
  float fStack_58f8;
  float fStack_58f4;
  float fStack_58f0;
  float fStack_58ec;
  float fStack_58e8;
  uint uStack_58e4;
  float local_58e0;
  float fStack_58dc;
  float fStack_58d8;
  float fStack_58d4;
  float fStack_58d0;
  float fStack_58cc;
  float fStack_58c8;
  uint uStack_58c4;
  float local_58c0;
  float fStack_58bc;
  float fStack_58b8;
  float fStack_58b4;
  float fStack_58b0;
  float fStack_58ac;
  float fStack_58a8;
  uint uStack_58a4;
  undefined1 local_58a0 [32];
  undefined1 local_5880 [32];
  undefined1 local_5860 [32];
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 local_5840;
  undefined8 local_5810;
  ulong local_5808 [561];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  
  uVar15 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (uVar15 != 8) {
    auVar21 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
    auVar20 = vpcmpeqd_avx2(auVar21,(undefined1  [32])valid_i->field_0);
    auVar21 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(ZEXT816(0) << 0x40),5);
    auVar24 = auVar20 & auVar21;
    if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar24 >> 0x7f,0) != '\0') ||
          (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar24 >> 0xbf,0) != '\0') ||
        (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar24[0x1f] < '\0')
    {
      local_59b8 = ray + 0x100;
      auVar21 = vandps_avx(auVar21,auVar20);
      auVar5 = vpackssdw_avx(auVar21._0_16_,auVar21._16_16_);
      auVar21 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),ZEXT1632(ZEXT816(0) << 0x40));
      local_59a0 = vpmovsxwd_avx2(auVar5);
      local_4680._8_4_ = 0x7f800000;
      local_4680._0_8_ = 0x7f8000007f800000;
      local_4680._12_4_ = 0x7f800000;
      local_4680._16_4_ = 0x7f800000;
      local_4680._20_4_ = 0x7f800000;
      local_4680._24_4_ = 0x7f800000;
      local_4680._28_4_ = 0x7f800000;
      local_5860 = vblendvps_avx(local_4680,auVar21,local_59a0);
      auVar6 = vpcmpeqd_avx(auVar21._0_16_,auVar21._0_16_);
      uStack_58e4 = *(uint *)(ray + 0x1c) ^ 0x80000000;
      auVar21 = *(undefined1 (*) [32])(ray + 0x20);
      auVar25 = ZEXT3264(CONCAT428(auVar21._28_4_ ^ 0x80000000,
                                   CONCAT424(-auVar21._24_4_,
                                             CONCAT420(-auVar21._20_4_,
                                                       CONCAT416(-auVar21._16_4_,
                                                                 CONCAT412(-auVar21._12_4_,
                                                                           CONCAT48(-auVar21._8_4_,
                                                                                    auVar21._0_8_ ^
                                                                                                                                                                        
                                                  0x8000000080000000)))))));
      local_5980 = vpmovsxwd_avx2(auVar5 ^ auVar6);
      auVar24 = *(undefined1 (*) [32])(ray + 0x40);
      local_5810 = 0xfffffffffffffff8;
      local_5808[0] = uVar15;
      local_4660 = local_5860;
      if (uVar15 != 0xfffffffffffffff8) {
        auVar37._8_4_ = 0x7fffffff;
        auVar37._0_8_ = 0x7fffffff7fffffff;
        auVar37._12_4_ = 0x7fffffff;
        auVar37._16_4_ = 0x7fffffff;
        auVar37._20_4_ = 0x7fffffff;
        auVar37._24_4_ = 0x7fffffff;
        auVar37._28_4_ = 0x7fffffff;
        auVar20 = vandps_avx(*(undefined1 (*) [32])(ray + 0x80),auVar37);
        auVar41._8_4_ = 0x219392ef;
        auVar41._0_8_ = 0x219392ef219392ef;
        auVar41._12_4_ = 0x219392ef;
        auVar41._16_4_ = 0x219392ef;
        auVar41._20_4_ = 0x219392ef;
        auVar41._24_4_ = 0x219392ef;
        auVar41._28_4_ = 0x219392ef;
        auVar20 = vcmpps_avx(auVar20,auVar41,1);
        auVar22 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0x80),auVar41,auVar20);
        auVar20 = vandps_avx(*(undefined1 (*) [32])(ray + 0xa0),auVar37);
        auVar20 = vcmpps_avx(auVar20,auVar41,1);
        auVar4 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0xa0),auVar41,auVar20);
        auVar20 = vandps_avx(*(undefined1 (*) [32])(ray + 0xc0),auVar37);
        auVar20 = vcmpps_avx(auVar20,auVar41,1);
        auVar37 = vrcpps_avx(auVar22);
        auVar20 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0xc0),auVar41,auVar20);
        auVar28._8_4_ = 0x3f800000;
        auVar28._0_8_ = 0x3f8000003f800000;
        auVar28._12_4_ = 0x3f800000;
        auVar28._16_4_ = 0x3f800000;
        auVar28._20_4_ = 0x3f800000;
        auVar28._24_4_ = 0x3f800000;
        auVar28._28_4_ = 0x3f800000;
        auVar41 = vrcpps_avx(auVar4);
        auVar7 = vrcpps_avx(auVar20);
        auVar6 = vfnmadd213ps_fma(auVar22,auVar37,auVar28);
        auVar5 = vfnmadd213ps_fma(auVar4,auVar41,auVar28);
        auVar11 = vfnmadd213ps_fma(auVar20,auVar7,auVar28);
        auVar5 = vfmadd132ps_fma(ZEXT1632(auVar5),auVar41,auVar41);
        auVar6 = vfmadd132ps_fma(ZEXT1632(auVar6),auVar37,auVar37);
        auVar45 = ZEXT1664(auVar6);
        auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar7,auVar7);
        puVar17 = local_5808;
        local_58c0 = auVar6._0_4_ * -*(float *)ray;
        fStack_58bc = auVar6._4_4_ * -*(float *)(ray + 4);
        fStack_58b8 = auVar6._8_4_ * -*(float *)(ray + 8);
        fStack_58b4 = auVar6._12_4_ * -*(float *)(ray + 0xc);
        fStack_58b0 = -*(float *)(ray + 0x10) * 0.0;
        fStack_58ac = -*(float *)(ray + 0x14) * 0.0;
        fStack_58a8 = -*(float *)(ray + 0x18) * 0.0;
        local_5880 = ZEXT1632(auVar5);
        local_58e0 = auVar5._0_4_ * -auVar21._0_4_;
        fStack_58dc = auVar5._4_4_ * -auVar21._4_4_;
        fStack_58d8 = auVar5._8_4_ * -auVar21._8_4_;
        fStack_58d4 = auVar5._12_4_ * -auVar21._12_4_;
        fStack_58d0 = -auVar21._16_4_ * 0.0;
        fStack_58cc = -auVar21._20_4_ * 0.0;
        fStack_58c8 = -auVar21._24_4_ * 0.0;
        local_58a0 = ZEXT1632(auVar11);
        local_5900 = auVar11._0_4_ * -auVar24._0_4_;
        fStack_58fc = auVar11._4_4_ * -auVar24._4_4_;
        fStack_58f8 = auVar11._8_4_ * -auVar24._8_4_;
        fStack_58f4 = auVar11._12_4_ * -auVar24._12_4_;
        fStack_58f0 = -auVar24._16_4_ * 0.0;
        fStack_58ec = -auVar24._20_4_ * 0.0;
        fStack_58e8 = -auVar24._24_4_ * 0.0;
        auVar21 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT432(0) << 0x20);
        auVar24._8_4_ = 0xff800000;
        auVar24._0_8_ = 0xff800000ff800000;
        auVar24._12_4_ = 0xff800000;
        auVar24._16_4_ = 0xff800000;
        auVar24._20_4_ = 0xff800000;
        auVar24._24_4_ = 0xff800000;
        auVar24._28_4_ = 0xff800000;
        auVar21 = vblendvps_avx(auVar24,auVar21,local_59a0);
        auVar44 = ZEXT3264(auVar21);
        pauVar16 = (undefined1 (*) [32])local_4640;
        local_5940 = ZEXT1632(auVar6);
        local_59b0 = context;
        uStack_58c4 = uStack_58e4;
        uStack_58a4 = uStack_58e4;
LAB_00613fa9:
        do {
          auVar21 = pauVar16[-1];
          pauVar16 = pauVar16 + -1;
          local_5920 = auVar44._0_32_;
          auVar24 = vcmpps_avx(auVar21,local_5920,1);
          if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar24 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar24 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar24 >> 0x7f,0) == '\0') &&
                (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar24 >> 0xbf,0) == '\0') &&
              (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar24[0x1f]) goto LAB_00614308;
          do {
            uVar18 = (uint)uVar15;
            if ((uVar15 & 8) != 0) {
              if (uVar15 == 0xfffffffffffffff8) goto LAB_00614328;
              auVar21 = vcmpps_avx(local_5920,auVar21,6);
              if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar21 >> 0x7f,0) == '\0') &&
                    (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar21 >> 0xbf,0) == '\0') &&
                  (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar21[0x1f]) goto LAB_00614308;
              auVar21 = vpcmpeqd_avx2(auVar25._0_32_,auVar25._0_32_);
              local_59a8 = (ulong)(uVar18 & 0xf) - 8;
              auVar20 = local_5980;
              if (local_59a8 == 0) goto LAB_006142e8;
              prim = (Primitive *)(uVar15 & 0xfffffffffffffff0);
              local_59c0 = 1;
              aVar3 = (anon_union_32_3_898e2e57_for_vboolf_impl<8>_1)(local_5980 ^ auVar21);
              goto LAB_0061425e;
            }
            uVar13 = uVar15 & 0xfffffffffffffff0;
            auVar22._8_4_ = 0x7f800000;
            auVar22._0_8_ = 0x7f8000007f800000;
            auVar22._12_4_ = 0x7f800000;
            auVar22._16_4_ = 0x7f800000;
            auVar22._20_4_ = 0x7f800000;
            auVar22._24_4_ = 0x7f800000;
            auVar22._28_4_ = 0x7f800000;
            lVar14 = -0x20;
            uVar15 = 8;
            do {
              uVar2 = *(ulong *)(uVar13 + 0x40 + lVar14 * 2);
              if (uVar2 == 8) {
                auVar25 = ZEXT3264(auVar22);
                break;
              }
              uVar1 = *(undefined4 *)(uVar13 + 0x120 + lVar14);
              auVar29._4_4_ = uVar1;
              auVar29._0_4_ = uVar1;
              auVar29._8_4_ = uVar1;
              auVar29._12_4_ = uVar1;
              auVar29._16_4_ = uVar1;
              auVar29._20_4_ = uVar1;
              auVar29._24_4_ = uVar1;
              auVar29._28_4_ = uVar1;
              uVar1 = *(undefined4 *)(uVar13 + 0x60 + lVar14);
              auVar26._4_4_ = uVar1;
              auVar26._0_4_ = uVar1;
              auVar26._8_4_ = uVar1;
              auVar26._12_4_ = uVar1;
              auVar26._16_4_ = uVar1;
              auVar26._20_4_ = uVar1;
              auVar26._24_4_ = uVar1;
              auVar26._28_4_ = uVar1;
              auVar24 = *(undefined1 (*) [32])(ray + 0xe0);
              uVar1 = *(undefined4 *)(uVar13 + 0x160 + lVar14);
              auVar34._4_4_ = uVar1;
              auVar34._0_4_ = uVar1;
              auVar34._8_4_ = uVar1;
              auVar34._12_4_ = uVar1;
              auVar34._16_4_ = uVar1;
              auVar34._20_4_ = uVar1;
              auVar34._24_4_ = uVar1;
              auVar34._28_4_ = uVar1;
              auVar5 = vfmadd231ps_fma(auVar26,auVar24,auVar29);
              uVar1 = *(undefined4 *)(uVar13 + 0xa0 + lVar14);
              auVar32._4_4_ = uVar1;
              auVar32._0_4_ = uVar1;
              auVar32._8_4_ = uVar1;
              auVar32._12_4_ = uVar1;
              auVar32._16_4_ = uVar1;
              auVar32._20_4_ = uVar1;
              auVar32._24_4_ = uVar1;
              auVar32._28_4_ = uVar1;
              auVar6 = vfmadd231ps_fma(auVar32,auVar24,auVar34);
              uVar1 = *(undefined4 *)(uVar13 + 0x1a0 + lVar14);
              auVar30._4_4_ = uVar1;
              auVar30._0_4_ = uVar1;
              auVar30._8_4_ = uVar1;
              auVar30._12_4_ = uVar1;
              auVar30._16_4_ = uVar1;
              auVar30._20_4_ = uVar1;
              auVar30._24_4_ = uVar1;
              auVar30._28_4_ = uVar1;
              uVar1 = *(undefined4 *)(uVar13 + 0xe0 + lVar14);
              auVar35._4_4_ = uVar1;
              auVar35._0_4_ = uVar1;
              auVar35._8_4_ = uVar1;
              auVar35._12_4_ = uVar1;
              auVar35._16_4_ = uVar1;
              auVar35._20_4_ = uVar1;
              auVar35._24_4_ = uVar1;
              auVar35._28_4_ = uVar1;
              uVar1 = *(undefined4 *)(uVar13 + 0x140 + lVar14);
              auVar38._4_4_ = uVar1;
              auVar38._0_4_ = uVar1;
              auVar38._8_4_ = uVar1;
              auVar38._12_4_ = uVar1;
              auVar38._16_4_ = uVar1;
              auVar38._20_4_ = uVar1;
              auVar38._24_4_ = uVar1;
              auVar38._28_4_ = uVar1;
              uVar1 = *(undefined4 *)(uVar13 + 0x80 + lVar14);
              auVar40._4_4_ = uVar1;
              auVar40._0_4_ = uVar1;
              auVar40._8_4_ = uVar1;
              auVar40._12_4_ = uVar1;
              auVar40._16_4_ = uVar1;
              auVar40._20_4_ = uVar1;
              auVar40._24_4_ = uVar1;
              auVar40._28_4_ = uVar1;
              auVar11 = vfmadd231ps_fma(auVar35,auVar24,auVar30);
              auVar8 = vfmadd231ps_fma(auVar40,auVar24,auVar38);
              uVar1 = *(undefined4 *)(uVar13 + 0x180 + lVar14);
              auVar31._4_4_ = uVar1;
              auVar31._0_4_ = uVar1;
              auVar31._8_4_ = uVar1;
              auVar31._12_4_ = uVar1;
              auVar31._16_4_ = uVar1;
              auVar31._20_4_ = uVar1;
              auVar31._24_4_ = uVar1;
              auVar31._28_4_ = uVar1;
              uVar1 = *(undefined4 *)(uVar13 + 0xc0 + lVar14);
              auVar39._4_4_ = uVar1;
              auVar39._0_4_ = uVar1;
              auVar39._8_4_ = uVar1;
              auVar39._12_4_ = uVar1;
              auVar39._16_4_ = uVar1;
              auVar39._20_4_ = uVar1;
              auVar39._24_4_ = uVar1;
              auVar39._28_4_ = uVar1;
              uVar1 = *(undefined4 *)(uVar13 + 0x1c0 + lVar14);
              auVar42._4_4_ = uVar1;
              auVar42._0_4_ = uVar1;
              auVar42._8_4_ = uVar1;
              auVar42._12_4_ = uVar1;
              auVar42._16_4_ = uVar1;
              auVar42._20_4_ = uVar1;
              auVar42._24_4_ = uVar1;
              auVar42._28_4_ = uVar1;
              auVar9 = vfmadd231ps_fma(auVar39,auVar24,auVar31);
              uVar1 = *(undefined4 *)(uVar13 + 0x100 + lVar14);
              auVar43._4_4_ = uVar1;
              auVar43._0_4_ = uVar1;
              auVar43._8_4_ = uVar1;
              auVar43._12_4_ = uVar1;
              auVar43._16_4_ = uVar1;
              auVar43._20_4_ = uVar1;
              auVar43._24_4_ = uVar1;
              auVar43._28_4_ = uVar1;
              auVar10 = vfmadd231ps_fma(auVar43,auVar24,auVar42);
              auVar12._4_4_ = fStack_58bc;
              auVar12._0_4_ = local_58c0;
              auVar12._8_4_ = fStack_58b8;
              auVar12._12_4_ = fStack_58b4;
              auVar12._16_4_ = fStack_58b0;
              auVar12._20_4_ = fStack_58ac;
              auVar12._24_4_ = fStack_58a8;
              auVar12._28_4_ = uStack_58a4;
              auVar5 = vfmadd213ps_fma(ZEXT1632(auVar5),auVar45._0_32_,auVar12);
              auVar7._4_4_ = fStack_58dc;
              auVar7._0_4_ = local_58e0;
              auVar7._8_4_ = fStack_58d8;
              auVar7._12_4_ = fStack_58d4;
              auVar7._16_4_ = fStack_58d0;
              auVar7._20_4_ = fStack_58cc;
              auVar7._24_4_ = fStack_58c8;
              auVar7._28_4_ = uStack_58c4;
              auVar6 = vfmadd213ps_fma(ZEXT1632(auVar6),local_5880,auVar7);
              auVar4._4_4_ = fStack_58fc;
              auVar4._0_4_ = local_5900;
              auVar4._8_4_ = fStack_58f8;
              auVar4._12_4_ = fStack_58f4;
              auVar4._16_4_ = fStack_58f0;
              auVar4._20_4_ = fStack_58ec;
              auVar4._24_4_ = fStack_58e8;
              auVar4._28_4_ = uStack_58e4;
              auVar11 = vfmadd213ps_fma(ZEXT1632(auVar11),local_58a0,auVar4);
              auVar8 = vfmadd213ps_fma(ZEXT1632(auVar8),auVar45._0_32_,auVar12);
              auVar9 = vfmadd213ps_fma(ZEXT1632(auVar9),local_5880,auVar7);
              auVar10 = vfmadd213ps_fma(ZEXT1632(auVar10),local_58a0,auVar4);
              auVar20 = vpminsd_avx2(ZEXT1632(auVar5),ZEXT1632(auVar8));
              auVar4 = vpminsd_avx2(ZEXT1632(auVar6),ZEXT1632(auVar9));
              auVar20 = vpmaxsd_avx2(auVar20,auVar4);
              auVar4 = vpminsd_avx2(ZEXT1632(auVar11),ZEXT1632(auVar10));
              auVar4 = vpmaxsd_avx2(auVar20,auVar4);
              auVar20 = vpmaxsd_avx2(ZEXT1632(auVar5),ZEXT1632(auVar8));
              auVar37 = vpmaxsd_avx2(ZEXT1632(auVar6),ZEXT1632(auVar9));
              auVar37 = vpminsd_avx2(auVar20,auVar37);
              auVar20 = vpmaxsd_avx2(ZEXT1632(auVar11),ZEXT1632(auVar10));
              auVar20 = vpminsd_avx2(auVar20,local_5920);
              auVar37 = vpminsd_avx2(auVar37,auVar20);
              auVar20 = vpmaxsd_avx2(auVar4,local_5860);
              auVar20 = vcmpps_avx(auVar20,auVar37,2);
              if ((uVar18 & 7) == 6) {
                uVar1 = *(undefined4 *)(uVar13 + 0x1e0 + lVar14);
                auVar33._4_4_ = uVar1;
                auVar33._0_4_ = uVar1;
                auVar33._8_4_ = uVar1;
                auVar33._12_4_ = uVar1;
                auVar33._16_4_ = uVar1;
                auVar33._20_4_ = uVar1;
                auVar33._24_4_ = uVar1;
                auVar33._28_4_ = uVar1;
                auVar37 = vcmpps_avx(auVar33,auVar24,2);
                uVar1 = *(undefined4 *)(uVar13 + 0x200 + lVar14);
                auVar36._4_4_ = uVar1;
                auVar36._0_4_ = uVar1;
                auVar36._8_4_ = uVar1;
                auVar36._12_4_ = uVar1;
                auVar36._16_4_ = uVar1;
                auVar36._20_4_ = uVar1;
                auVar36._24_4_ = uVar1;
                auVar36._28_4_ = uVar1;
                auVar24 = vcmpps_avx(auVar24,auVar36,1);
                auVar24 = vandps_avx(auVar37,auVar24);
                auVar24 = vandps_avx(auVar24,auVar20);
                auVar5 = vpackssdw_avx(auVar24._0_16_,auVar24._16_16_);
              }
              else {
                auVar5 = vpackssdw_avx(auVar20._0_16_,auVar20._16_16_);
              }
              auVar24 = vcmpps_avx(local_5920,auVar21,6);
              auVar6 = vpackssdw_avx(auVar24._0_16_,auVar24._16_16_);
              auVar5 = vpand_avx(auVar5,auVar6);
              auVar24 = vpmovzxwd_avx2(auVar5);
              auVar24 = vpslld_avx2(auVar24,0x1f);
              if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar24 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar24 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar24 >> 0x7f,0) == '\0') &&
                    (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar24 >> 0xbf,0) == '\0') &&
                  (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar24[0x1f]) {
                auVar25 = ZEXT3264(auVar22);
                uVar2 = uVar15;
              }
              else {
                auVar27._8_4_ = 0x7f800000;
                auVar27._0_8_ = 0x7f8000007f800000;
                auVar27._12_4_ = 0x7f800000;
                auVar27._16_4_ = 0x7f800000;
                auVar27._20_4_ = 0x7f800000;
                auVar27._24_4_ = 0x7f800000;
                auVar27._28_4_ = 0x7f800000;
                auVar24 = vblendvps_avx(auVar27,auVar4,auVar24);
                auVar25 = ZEXT3264(auVar24);
                if (uVar15 != 8) {
                  *puVar17 = uVar15;
                  puVar17 = puVar17 + 1;
                  *pauVar16 = auVar22;
                  pauVar16 = pauVar16 + 1;
                }
              }
              uVar15 = uVar2;
              auVar22 = auVar25._0_32_;
              lVar14 = lVar14 + 4;
            } while (lVar14 != 0);
            auVar21 = auVar25._0_32_;
          } while (uVar15 != 8);
          uVar15 = puVar17[-1];
          puVar17 = puVar17 + -1;
        } while (uVar15 != 0xfffffffffffffff8);
      }
LAB_00614328:
      auVar21 = vandps_avx(local_59a0,local_5980);
      auVar23._8_4_ = 0xff800000;
      auVar23._0_8_ = 0xff800000ff800000;
      auVar23._12_4_ = 0xff800000;
      auVar23._16_4_ = 0xff800000;
      auVar23._20_4_ = 0xff800000;
      auVar23._24_4_ = 0xff800000;
      auVar23._28_4_ = 0xff800000;
      auVar21 = vmaskmovps_avx(auVar21,auVar23);
      *(undefined1 (*) [32])local_59b8 = auVar21;
    }
  }
  return;
  while( true ) {
    prim = prim + 1;
    bVar19 = local_59a8 <= local_59c0;
    local_59c0 = local_59c0 + 1;
    if (bVar19) break;
LAB_0061425e:
    local_5960 = aVar3;
    InstanceIntersectorKMB<8>::occluded
              ((vbool<8> *)&local_5840.field_1,(vbool<8> *)&local_5960.field_1,&local_59c1,ray,
               local_59b0,prim);
    aVar3.v = (__m256)vandnps_avx(local_5840.v,local_5960.v);
    auVar21 = (undefined1  [32])local_5960 & ~(undefined1  [32])local_5840;
    if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar21 >> 0x7f,0) == '\0') &&
          (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar21 >> 0xbf,0) == '\0') &&
        (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar21[0x1f])
    break;
  }
  auVar21 = vpcmpeqd_avx2((undefined1  [32])local_5960,(undefined1  [32])local_5960);
  auVar20._0_4_ = aVar3.i[0] ^ auVar21._0_4_;
  auVar20._4_4_ = aVar3.i[1] ^ auVar21._4_4_;
  auVar20._8_4_ = aVar3.i[2] ^ auVar21._8_4_;
  auVar20._12_4_ = aVar3.i[3] ^ auVar21._12_4_;
  auVar20._16_4_ = aVar3.i[4] ^ auVar21._16_4_;
  auVar20._20_4_ = aVar3.i[5] ^ auVar21._20_4_;
  auVar20._24_4_ = aVar3.i[6] ^ auVar21._24_4_;
  auVar20._28_4_ = aVar3.i[7] ^ auVar21._28_4_;
  auVar45 = ZEXT3264(local_5940);
LAB_006142e8:
  auVar25 = ZEXT3264(auVar21);
  local_5980 = vpor_avx2(local_5980,auVar20);
  auVar21 = auVar21 & ~local_5980;
  if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar21 >> 0x7f,0) == '\0') &&
        (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar21 >> 0xbf,0) == '\0') &&
      (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar21[0x1f])
  goto LAB_00614328;
  auVar21._8_4_ = 0xff800000;
  auVar21._0_8_ = 0xff800000ff800000;
  auVar21._12_4_ = 0xff800000;
  auVar21._16_4_ = 0xff800000;
  auVar21._20_4_ = 0xff800000;
  auVar21._24_4_ = 0xff800000;
  auVar21._28_4_ = 0xff800000;
  auVar21 = vblendvps_avx(local_5920,auVar21,local_5980);
  auVar44 = ZEXT3264(auVar21);
LAB_00614308:
  uVar15 = puVar17[-1];
  puVar17 = puVar17 + -1;
  if (uVar15 == 0xfffffffffffffff8) goto LAB_00614328;
  goto LAB_00613fa9;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }